

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_store_Fptr(FITSfile *Fptr,int *status)

{
  int ii;
  int *status_local;
  FITSfile *Fptr_local;
  int local_4;
  
  if (*status < 1) {
    for (ii = 0; ii < 10000; ii = ii + 1) {
      if (FptrTable[ii] == (FITSfile *)0x0) {
        FptrTable[ii] = Fptr;
        break;
      }
    }
    local_4 = *status;
  }
  else {
    local_4 = *status;
  }
  return local_4;
}

Assistant:

int fits_store_Fptr(FITSfile *Fptr,  /* O - FITS file pointer               */ 
           int *status)              /* IO - error status                   */
/*
   store the new Fptr address for future use by fits_already_open 
*/
{
    int ii;

    if (*status > 0)
        return(*status);

    FFLOCK;
    for (ii = 0; ii < NMAXFILES; ii++) {
        if (FptrTable[ii] == 0) {
            FptrTable[ii] = Fptr;
            break;
        }
    }
    FFUNLOCK;
    return(*status);
}